

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O1

CURLcode curl_easy_recv(CURL *d,void *buffer,size_t buflen,size_t *n)

{
  _Bool _Var1;
  CURLcode CVar2;
  connectdata *c;
  ssize_t n1;
  connectdata *local_38;
  size_t local_30;
  
  _Var1 = Curl_is_in_callback((Curl_easy *)d);
  CVar2 = CURLE_RECURSIVE_API_CALL;
  if ((!_Var1) && (CVar2 = easy_connection((Curl_easy *)d,&local_38), CVar2 == CURLE_OK)) {
    if (*(long *)((long)d + 0x20) == 0) {
      Curl_attach_connection((Curl_easy *)d,local_38);
    }
    *n = 0;
    CVar2 = Curl_conn_recv((Curl_easy *)d,0,(char *)buffer,buflen,(ssize_t *)&local_30);
    if (CVar2 == CURLE_OK) {
      *n = local_30;
      CVar2 = CURLE_OK;
    }
  }
  return CVar2;
}

Assistant:

CURLcode curl_easy_recv(CURL *d, void *buffer, size_t buflen, size_t *n)
{
  CURLcode result;
  ssize_t n1;
  struct connectdata *c;
  struct Curl_easy *data = d;

  if(Curl_is_in_callback(data))
    return CURLE_RECURSIVE_API_CALL;

  result = easy_connection(data, &c);
  if(result)
    return result;

  if(!data->conn)
    /* on first invoke, the transfer has been detached from the connection and
       needs to be reattached */
    Curl_attach_connection(data, c);

  *n = 0;
  result = Curl_conn_recv(data, FIRSTSOCKET, buffer, buflen, &n1);

  if(result)
    return result;

  *n = (size_t)n1;
  return CURLE_OK;
}